

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O2

ImVector_int * ImVector_int_ImVector_intVector(ImVector_int *src)

{
  ImVector<int> *this;
  
  this = (ImVector<int> *)ImGui::MemAlloc(0x10);
  ImVector<int>::ImVector(this,src);
  return this;
}

Assistant:

CIMGUI_API ImVector_int* ImVector_int_ImVector_intVector(const ImVector_int src)
{
    return IM_NEW(ImVector_int)(src);
}